

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException(SAXParseException *this,SAXParseException *toCopy)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLFileLoc XVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryManager *pMVar6;
  size_t sVar7;
  XMLCh *pXVar5;
  
  SAXException::SAXException(&this->super_SAXException,&toCopy->super_SAXException);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_0040bca8;
  XVar3 = toCopy->fLineNumber;
  this->fColumnNumber = toCopy->fColumnNumber;
  this->fLineNumber = XVar3;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  pMVar6 = (toCopy->super_SAXException).fMemoryManager;
  pXVar2 = toCopy->fPublicId;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar7 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar7);
      sVar7 = sVar7 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar5,pXVar2,sVar7);
    pMVar6 = (toCopy->super_SAXException).fMemoryManager;
  }
  this->fPublicId = pXVar5;
  pXVar2 = toCopy->fSystemId;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar7 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar7);
      sVar7 = sVar7 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    memcpy(pXVar5,pXVar2,sVar7);
  }
  this->fSystemId = pXVar5;
  return;
}

Assistant:

SAXParseException::SAXParseException(const SAXParseException& toCopy) :

    SAXException(toCopy)
    , fColumnNumber(toCopy.fColumnNumber)
    , fLineNumber(toCopy.fLineNumber)
    , fPublicId(0)
    , fSystemId(0)
{
    fPublicId = XMLString::replicate(toCopy.fPublicId, toCopy.fMemoryManager);
    fSystemId = XMLString::replicate(toCopy.fSystemId, toCopy.fMemoryManager);
}